

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O1

void UnitTest::ExecuteTest<(anonymous_namespace)::TestRunnerFixtureReporterNotifiedOfFailuresHelper>
               (TestRunnerFixtureReporterNotifiedOfFailuresHelper *testObject,TestDetails *details)

{
  TestList *this;
  TestResults *results;
  int iVar1;
  TestDetails **ppTVar2;
  TestResults **ppTVar3;
  undefined8 *puVar4;
  MockTest test3;
  MockTest test2;
  MockTest test1;
  SignalTranslator sig;
  int local_55c;
  TestDetails local_558;
  Test local_538;
  Test local_500;
  Test local_4c8;
  SignalTranslator local_490;
  
  ppTVar2 = CurrentTest::Details();
  *ppTVar2 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar1 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar1 == 0) {
    Test::Test(&local_4c8,"test","DefaultSuite","",0);
    local_4c8._vptr_Test = (_func_int **)&PTR__Test_00151f40;
    local_4c8._49_2_ = 0;
    local_4c8._52_4_ = 2;
    Test::Test(&local_500,"test","DefaultSuite","",0);
    local_500._vptr_Test = (_func_int **)&PTR__Test_00151f40;
    local_500._49_2_ = 1;
    local_500._52_4_ = 1;
    Test::Test(&local_538,"test","DefaultSuite","",0);
    local_538._vptr_Test = (_func_int **)&PTR__Test_00151f40;
    local_538._49_2_ = 0;
    local_538._52_4_ = 3;
    this = &(testObject->super_TestRunnerFixture).list;
    TestList::Add(this,&local_4c8);
    TestList::Add(this,&local_500);
    TestList::Add(this,&local_538);
    TestRunner::RunTestsIf<UnitTest::True>
              (&(testObject->super_TestRunnerFixture).runner,this,(char *)0x0,(True *)&local_558,0);
    ppTVar3 = CurrentTest::Results();
    results = *ppTVar3;
    local_55c = 5;
    ppTVar2 = CurrentTest::Details();
    TestDetails::TestDetails(&local_558,*ppTVar2,0xa0);
    CheckEqual<int,int>(results,&local_55c,
                        &(testObject->super_TestRunnerFixture).reporter.summaryFailureCount,
                        &local_558);
    Test::~Test(&local_538);
    Test::~Test(&local_500);
    Test::~Test(&local_4c8);
    SignalTranslator::~SignalTranslator(&local_490);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "Unhandled system exception";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}